

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dirent.cpp
# Opt level: O3

DIR * __thiscall pstore::romfs::dirent::opendir(dirent *this,char *__name)

{
  directory *pdVar1;
  directory **ppdVar2;
  error_code *peVar3;
  error_code eVar4;
  error_or<const_pstore::romfs::directory_*> local_40;
  
  if ((*(int *)(__name + 0x18) == 1) && (*(long *)(__name + 0x10) == 8)) {
    pdVar1 = *(directory **)(__name + 8);
    local_40.has_error_ = false;
    ppdVar2 = error_or<pstore::romfs::directory_const*>::
              value_storage_impl<pstore::error_or<pstore::romfs::directory_const*>&,pstore::romfs::directory_const*>
                        (&local_40);
    *ppdVar2 = pdVar1;
    *(undefined1 *)&(this->stat_).size = 1;
    error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>::
    move_construct<pstore::romfs::directory_const*>
              ((error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>> *)this,&local_40);
  }
  else {
    eVar4 = make_error_code(enotdir);
    local_40.has_error_ = true;
    peVar3 = error_or<pstore::romfs::directory_const*>::
             error_storage_impl<pstore::error_or<pstore::romfs::directory_const*>&,std::error_code>
                       (&local_40);
    peVar3->_M_value = eVar4._M_value;
    peVar3->_M_cat = eVar4._M_cat;
    *(undefined1 *)&(this->stat_).size = 1;
    error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>::
    move_construct<pstore::romfs::directory_const*>
              ((error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>> *)this,&local_40);
  }
  if (local_40.has_error_ == false) {
    error_or<pstore::romfs::directory_const*>::
    value_storage_impl<pstore::error_or<pstore::romfs::directory_const*>&,pstore::romfs::directory_const*>
              (&local_40);
  }
  else {
    error_or<pstore::romfs::directory_const*>::
    error_storage_impl<pstore::error_or<pstore::romfs::directory_const*>&,std::error_code>
              (&local_40);
  }
  return (DIR *)this;
}

Assistant:

auto pstore::romfs::dirent::opendir () const -> error_or<gsl::not_null<class directory const *>> {
    // NOLINTNEXTLINE (bugprone-sizeof-expression)
    if (!is_directory () || stat_.size != sizeof (directory const *)) {
        return error_or<directory const *> (make_error_code (error_code::enotdir));
    }
    return error_or<directory const *> (reinterpret_cast<directory const *> (contents_.get ()));
}